

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O3

void duckdb::AggregateFunction::
     StateInitialize<duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>,(duckdb::AggregateDestructorType)1>
               (AggregateFunction *param_1,data_ptr_t state)

{
  ModeState<int,_duckdb::ModeStandard<int>_>::ModeState
            ((ModeState<int,_duckdb::ModeStandard<int>_> *)state);
  return;
}

Assistant:

static void StateInitialize(const AggregateFunction &, data_ptr_t state) {
		// FIXME: we should remove the "destructor_type" option in the future
#if !defined(__GNUC__) || (__GNUC__ >= 5)
		static_assert(std::is_trivially_move_constructible<STATE>::value ||
		                  destructor_type == AggregateDestructorType::LEGACY,
		              "Aggregate state must be trivially move constructible");
#endif
		OP::Initialize(*reinterpret_cast<STATE *>(state));
	}